

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O3

bool __thiscall
cmConditionEvaluator::IsKeyword
          (cmConditionEvaluator *this,string *keyword,cmExpandedCommandArgument *argument)

{
  size_t __n;
  bool bVar1;
  int iVar2;
  string *psVar3;
  ostream *poVar4;
  cmake *this_00;
  PolicyID id;
  ostringstream e;
  string local_1b8;
  undefined1 local_198 [376];
  
  if ((this->Policy54Status < NEW) ||
     (bVar1 = cmExpandedCommandArgument::WasQuoted(argument), !bVar1)) {
    psVar3 = cmExpandedCommandArgument::GetValue_abi_cxx11_(argument);
    __n = psVar3->_M_string_length;
    if ((__n == keyword->_M_string_length) &&
       ((__n == 0 ||
        (iVar2 = bcmp((psVar3->_M_dataplus)._M_p,(keyword->_M_dataplus)._M_p,__n), iVar2 == 0)))) {
      bVar1 = cmExpandedCommandArgument::WasQuoted(argument);
      if (!bVar1) {
        return true;
      }
      if (this->Policy54Status != WARN) {
        return true;
      }
      bVar1 = cmMakefile::HasCMP0054AlreadyBeenReported(this->Makefile,&this->ExecutionContext);
      if (bVar1) {
        return true;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1b8,(cmPolicies *)0x36,id);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_198,local_1b8._M_dataplus._M_p,local_1b8._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
        operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_198,"Quoted keywords like \"",0x16);
      psVar3 = cmExpandedCommandArgument::GetValue_abi_cxx11_(argument);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_198,(psVar3->_M_dataplus)._M_p,psVar3->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,
                 "\" will no longer be interpreted as keywords when the policy is set to NEW.  Since the policy is not set the OLD behavior will be used."
                 ,0x86);
      this_00 = cmMakefile::GetCMakeInstance(this->Makefile);
      std::__cxx11::stringbuf::str();
      cmake::IssueMessage(this_00,AUTHOR_WARNING,&local_1b8,&this->Backtrace);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
        operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
      std::ios_base::~ios_base((ios_base *)(local_198 + 0x70));
      return true;
    }
  }
  return false;
}

Assistant:

bool cmConditionEvaluator::IsKeyword(std::string const& keyword,
                                     cmExpandedCommandArgument& argument) const
{
  if ((this->Policy54Status != cmPolicies::WARN &&
       this->Policy54Status != cmPolicies::OLD) &&
      argument.WasQuoted()) {
    return false;
  }

  bool isKeyword = argument.GetValue() == keyword;

  if (isKeyword && argument.WasQuoted() &&
      this->Policy54Status == cmPolicies::WARN) {
    if (!this->Makefile.HasCMP0054AlreadyBeenReported(
          this->ExecutionContext)) {
      std::ostringstream e;
      e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0054) << "\n";
      e << "Quoted keywords like \"" << argument.GetValue()
        << "\" will no longer be interpreted as keywords "
           "when the policy is set to NEW.  "
           "Since the policy is not set the OLD behavior will be used.";

      this->Makefile.GetCMakeInstance()->IssueMessage(
        MessageType::AUTHOR_WARNING, e.str(), this->Backtrace);
    }
  }

  return isKeyword;
}